

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * make_D3D_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t in_R8;
  char *pcVar7;
  char *pcVar8;
  char acStack_85 [3];
  char swizzle_str [6];
  char rel_swizzle [4];
  char *local_70;
  char *local_68;
  char rel_regnum_str [16];
  char regnum_str [16];
  
  uVar2 = arg->src_mod - SRCMOD_NEGATE;
  if (uVar2 < 0xd) {
    pcVar8 = &DAT_00152bc4 + *(int *)(&DAT_00152bc4 + (ulong)uVar2 * 4);
    pcVar7 = &DAT_00152bf8 + *(int *)(&DAT_00152bf8 + (ulong)uVar2 * 4);
  }
  else {
    pcVar8 = "";
    pcVar7 = "";
  }
  pcVar4 = get_D3D_register_string(ctx,arg->regtype,arg->regnum,regnum_str,in_R8);
  if (pcVar4 == (char *)0x0) {
    failf(ctx,"%s","Unknown source register type.");
    *buf = '\0';
  }
  else {
    rel_swizzle[0] = '\0';
    rel_swizzle[1] = '\0';
    rel_swizzle[2] = '\0';
    rel_swizzle[3] = '\0';
    rel_regnum_str[0] = '\0';
    rel_regnum_str[1] = '\0';
    rel_regnum_str[2] = '\0';
    rel_regnum_str[3] = '\0';
    rel_regnum_str[4] = '\0';
    rel_regnum_str[5] = '\0';
    rel_regnum_str[6] = '\0';
    rel_regnum_str[7] = '\0';
    rel_regnum_str[8] = '\0';
    rel_regnum_str[9] = '\0';
    rel_regnum_str[10] = '\0';
    rel_regnum_str[0xb] = '\0';
    rel_regnum_str[0xc] = '\0';
    rel_regnum_str[0xd] = '\0';
    rel_regnum_str[0xe] = '\0';
    rel_regnum_str[0xf] = '\0';
    if (arg->relative == 0) {
      pcVar6 = "";
      local_70 = "";
      local_68 = "";
    }
    else {
      rel_swizzle[1] = "xyzw"[arg->relative_component];
      rel_swizzle[0] = '.';
      rel_swizzle[2] = '\0';
      rel_swizzle[3] = '\0';
      local_68 = get_D3D_register_string
                           (ctx,arg->relative_regtype,arg->relative_regnum,rel_regnum_str,in_R8);
      local_70 = "]";
      pcVar6 = "[";
    }
    iVar3 = isscalar(ctx,ctx->shader_type,arg->regtype,arg->regnum);
    if ((iVar3 == 0) && (arg->swizzle != 0xe4)) {
      swizzle_str[0] = '.';
      swizzle_str[1] = "xyzw"[arg->swizzle_x];
      swizzle_str[2] = "xyzw"[arg->swizzle_y];
      swizzle_str[3] = "xyzw"[arg->swizzle_z];
      swizzle_str[4] = "xyzw"[arg->swizzle_w];
      uVar1 = 6;
      do {
        uVar5 = uVar1;
        uVar1 = uVar5 - 1;
      } while (swizzle_str[4] == acStack_85[uVar5]);
      acStack_85[uVar5 + 2] = '\0';
      if (5 < uVar5 - 1) {
        __assert_fail("i < sizeof (swizzle_str)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x403,
                      "const char *make_D3D_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                     );
      }
    }
    else {
      swizzle_str[0] = '\0';
    }
    snprintf(buf,buflen,"%s%s%s%s%s%s%s%s%s%s",pcVar7,pcVar4,regnum_str,pcVar8,pcVar6,local_68,
             rel_regnum_str,rel_swizzle,local_70,swizzle_str);
  }
  return buf;
}

Assistant:

static const char *make_D3D_srcarg_string_in_buf(Context *ctx,
                                                 const SourceArgInfo *arg,
                                                 char *buf, size_t buflen)
{
    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            postmod_str = "_bias";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            postmod_str = "_bx2";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "1-";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            postmod_str = "_x2";
            break;

        case SRCMOD_DZ:
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            postmod_str = "_abs";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch


    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, arg->regtype,
                                                      arg->regnum, regnum_str,
                                                      sizeof (regnum_str));

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        *buf = '\0';
        return buf;
    } // if

    const char *rel_lbracket = "";
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    char rel_regnum_str[16] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_lbracket = "[";
        rel_rbracket = "]";
        rel_regtype_str = get_D3D_register_string(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  rel_regnum_str,
                                                  sizeof (rel_regnum_str));

        if (regtype_str == NULL)
        {
            fail(ctx, "Unknown relative source register type.");
            *buf = '\0';
            return buf;
        } // if
    } // if

    char swizzle_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';
        swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_w];

        // .xyzz is the same as .xyz, .z is the same as .zzzz, etc.
        while (swizzle_str[i-1] == swizzle_str[i-2])
            i--;
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    // !!! FIXME: c12[a0.x] actually needs to be c[a0.x + 12]
    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, regnum_str, postmod_str,
             rel_lbracket, rel_regtype_str, rel_regnum_str, rel_swizzle,
             rel_rbracket, swizzle_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}